

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve_geometry_device.cpp
# Opt level: O2

void embree::renderPixelStandard
               (TutorialData *data,int x,int y,int *pixels,uint width,uint height,float time,
               ISPCCamera *camera,RayStats *stats)

{
  undefined1 auVar1 [16];
  float fVar2;
  float fVar3;
  float fVar6;
  float fVar7;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar15;
  float fVar16;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  float fVar17;
  undefined1 auVar14 [16];
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float local_198;
  float fStack_194;
  undefined1 local_158 [8];
  float fStack_150;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  undefined8 local_138;
  uint local_128;
  undefined8 local_124;
  float local_11c;
  uint local_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  undefined4 uStack_108;
  undefined1 local_f8 [16];
  undefined1 local_e8 [8];
  float fStack_e0;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  undefined4 uStack_cc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  undefined4 uStack_bc;
  undefined8 local_b8;
  undefined4 local_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined4 uStack_88;
  undefined8 local_70;
  undefined1 local_68 [16];
  undefined8 local_58;
  undefined8 local_50;
  undefined1 local_48 [16];
  undefined8 local_38;
  
  fVar8 = (float)x;
  fVar10 = (float)y;
  local_148 = (camera->xfm).l.vz.field_0.field_0.x +
              fVar10 * (camera->xfm).l.vy.field_0.field_0.x +
              fVar8 * (camera->xfm).l.vx.field_0.field_0.x;
  fStack_144 = (camera->xfm).l.vz.field_0.field_0.y +
               fVar10 * (camera->xfm).l.vy.field_0.field_0.y +
               fVar8 * (camera->xfm).l.vx.field_0.field_0.y;
  fVar9 = (camera->xfm).l.vz.field_0.field_0.z +
          fVar10 * (camera->xfm).l.vy.field_0.field_0.z +
          fVar8 * (camera->xfm).l.vx.field_0.field_0.z;
  fVar8 = fVar10 * 0.0 + fVar8 * 0.0 + 0.0;
  fVar10 = fStack_144 * fStack_144;
  fVar16 = fVar9 * fVar9;
  fVar8 = fVar8 * fVar8;
  fVar18 = fVar10 + local_148 * local_148 + fVar16;
  fVar21 = fVar10 + fVar10 + fVar8;
  fVar16 = fVar10 + fVar16 + fVar16;
  fVar8 = fVar10 + fVar8 + fVar8;
  auVar11._4_4_ = fVar21;
  auVar11._0_4_ = fVar18;
  auVar11._8_4_ = fVar16;
  auVar11._12_4_ = fVar8;
  auVar12._4_4_ = fVar21;
  auVar12._0_4_ = fVar18;
  auVar12._8_4_ = fVar16;
  auVar12._12_4_ = fVar8;
  auVar12 = rsqrtss(auVar11,auVar12);
  fVar8 = auVar12._0_4_;
  fStack_140 = fVar8 * fVar8 * fVar18 * -0.5 * fVar8 + fVar8 * 1.5;
  local_148 = fStack_140 * local_148;
  fStack_144 = fStack_140 * fStack_144;
  fStack_140 = fStack_140 * fVar9;
  fStack_150 = (float)(int)((ulong)*(undefined8 *)((long)&(camera->xfm).p.field_0 + 4) >> 0x20);
  local_158 = *(undefined8 *)&(camera->xfm).p.field_0;
  register0x0000120c = 0;
  fStack_13c = 0.0;
  local_138 = 0xffffffff7f800000;
  local_114 = 0xffffffff;
  uStack_110 = 0xffffffff;
  uStack_10c = 0xffffffff;
  uStack_108 = 0xffffffff;
  local_50 = 0xe38e200000000;
  local_48 = (undefined1  [16])0x0;
  local_38 = 0;
  rtcTraversableIntersect1(data->g_traversable,local_158);
  stats->numRays = stats->numRays + 1;
  auVar4._0_12_ = ZEXT812(0x3f800000);
  auVar4._12_4_ = 0;
  fVar8 = 0.0;
  fVar9 = 0.0;
  fVar10 = 0.0;
  _local_e8 = auVar4;
  switch(uStack_110) {
  case 0:
switchD_0011d0c7_caseD_0:
    local_f8 = ZEXT416(local_128);
    local_68._0_12_ = ZEXT812(0);
    local_68._12_4_ = 0;
    auVar12 = rsqrtss(_local_e8,0x40400000);
    fVar8 = auVar12._0_4_;
    fVar16 = fVar8 * 1.5 - fVar8 * fVar8 * fVar8 * 1.5;
    fVar18 = fVar16 * -1.0;
    fVar21 = fVar16 * -1.0;
    fVar16 = fVar16 * -1.0;
    local_d8 = (float)local_138 * local_148 + (float)local_158._0_4_;
    fStack_d4 = (float)local_138 * fStack_144 + (float)local_158._4_4_;
    fStack_d0 = (float)local_138 * fStack_140 + fStack_150;
    fVar8 = local_e8._0_4_ * 0.5 + 0.0;
    fVar9 = local_e8._4_4_ * 0.5 + 0.0;
    fVar10 = local_e8._8_4_ * 0.5 + 0.0;
    local_c8 = -fVar18;
    fStack_c4 = -fVar21;
    fStack_c0 = -fVar16;
    uStack_cc = 0x3a83126f;
    uStack_bc = 0;
    local_b8 = 0xffffffff7f800000;
    local_94 = 0xffffffff;
    uStack_90 = 0xffffffff;
    uStack_8c = 0xffffffff;
    uStack_88 = 0xffffffff;
    local_70 = 0xe38e200000000;
    local_58 = 0;
    rtcTraversableOccluded1(data->g_traversable,&local_d8);
    stats->numRays = stats->numRays + 1;
    if (0.0 <= (float)local_b8) {
      local_198 = (float)local_124;
      fStack_194 = (float)((ulong)local_124 >> 0x20);
      fVar23 = local_f8._0_4_;
      auVar5._4_12_ = local_f8._4_12_;
      auVar5._0_4_ = fVar23 * fVar23 + local_198 * local_198 + fStack_194 * fStack_194;
      auVar13._4_4_ = local_f8._4_4_;
      auVar13._0_4_ = auVar5._0_4_;
      auVar13._8_4_ = local_f8._8_4_;
      auVar13._12_4_ = local_f8._12_4_;
      auVar12 = rsqrtss(auVar13,auVar5);
      fVar2 = auVar12._0_4_;
      fVar19 = fVar2 * 1.5 - fVar2 * fVar2 * auVar5._0_4_ * 0.5 * fVar2;
      fVar23 = fVar23 * fVar19;
      local_198 = fVar19 * local_198;
      fVar19 = fVar19 * fStack_194;
      fVar2 = fStack_140 * fVar19 + fStack_144 * local_198 + local_148 * fVar23;
      fVar2 = fVar2 + fVar2;
      fVar3 = fVar2 * fVar23 - local_148;
      fVar6 = fVar2 * local_198 - fStack_144;
      fVar7 = fVar2 * fVar19 - fStack_140;
      fVar2 = fVar2 * 0.0 - fStack_13c;
      fVar15 = fVar6 * fVar6;
      fVar17 = fVar7 * fVar7;
      fVar2 = fVar2 * fVar2;
      fVar20 = fVar15 + fVar3 * fVar3 + fVar17;
      fVar22 = fVar15 + fVar15 + fVar2;
      fVar17 = fVar15 + fVar17 + fVar17;
      fVar2 = fVar15 + fVar2 + fVar2;
      auVar14._4_4_ = fVar22;
      auVar14._0_4_ = fVar20;
      auVar14._8_4_ = fVar17;
      auVar14._12_4_ = fVar2;
      auVar1._4_4_ = fVar22;
      auVar1._0_4_ = fVar20;
      auVar1._8_4_ = fVar17;
      auVar1._12_4_ = fVar2;
      auVar12 = rsqrtss(auVar14,auVar1);
      fVar2 = auVar12._0_4_;
      fVar2 = fVar2 * 1.5 - fVar2 * fVar2 * fVar20 * 0.5 * fVar2;
      fVar2 = fVar2 * fVar7 * fVar16 + fVar2 * fVar6 * fVar21 + fVar2 * fVar3 * fVar18;
      if (1.0 <= fVar2) {
        fVar2 = 1.0;
      }
      fVar3 = 0.0;
      if (0.0 <= fVar2) {
        fVar3 = fVar2;
      }
      fVar2 = powf(fVar3,10.0);
      fVar16 = -(fVar19 * fVar16 + local_198 * fVar21 + fVar23 * fVar18);
      if (1.0 <= fVar16) {
        fVar16 = 1.0;
      }
      fVar18 = 0.0;
      if (0.0 <= fVar16) {
        fVar18 = fVar16;
      }
      fVar2 = fVar2 * 0.5;
      fVar8 = fVar8 + (float)local_e8._0_4_ * fVar18 + fVar2;
      fVar9 = fVar9 + (float)local_e8._4_4_ * fVar18 + fVar2;
      fVar10 = fVar10 + fStack_e0 * fVar18 + fVar2;
    }
  case 0xffffffff:
    if (1.0 <= fVar8) {
      fVar8 = 1.0;
    }
    fVar16 = 0.0;
    if (0.0 <= fVar8) {
      fVar16 = fVar8;
    }
    if (1.0 <= fVar9) {
      fVar9 = 1.0;
    }
    fVar8 = 0.0;
    if (0.0 <= fVar9) {
      fVar8 = fVar9;
    }
    if (1.0 <= fVar10) {
      fVar10 = 1.0;
    }
    fVar9 = 0.0;
    if (0.0 <= fVar10) {
      fVar9 = fVar10;
    }
    pixels[width * y + x] =
         (int)(long)(fVar8 * 255.0) * 0x100 + (int)(long)(fVar16 * 255.0) +
         (int)(long)(fVar9 * 255.0) * 0x10000;
    return;
  case 1:
  case 2:
  case 6:
    interpolate_linear((embree *)&local_d8,data,local_114,local_11c);
    break;
  case 3:
  case 4:
  case 5:
    interpolate_bspline((embree *)&local_d8,data,local_114,local_11c);
    break;
  case 7:
  case 8:
  case 9:
    interpolate_catmull_rom((embree *)&local_d8,data,local_114,local_11c);
    break;
  default:
    goto switchD_0011d0c7_default;
  }
  auVar4._4_4_ = fStack_d4;
  auVar4._0_4_ = local_d8;
  auVar4._8_4_ = fStack_d0;
  auVar4._12_4_ = uStack_cc;
switchD_0011d0c7_default:
  local_e8._0_4_ = auVar4._0_4_ * 0.5;
  local_e8._4_4_ = auVar4._4_4_ * 0.5;
  fStack_e0 = auVar4._8_4_ * 0.5;
  register0x0000120c = auVar4._12_4_ * 0.5;
  goto switchD_0011d0c7_caseD_0;
}

Assistant:

void renderPixelStandard(const TutorialData& data,
                         int x, int y, 
                         int* pixels,
                         const unsigned int width,
                         const unsigned int height,
                         const float time,
                         const ISPCCamera& camera, RayStats& stats)
{
  /* initialize ray */
  Ray ray(Vec3fa(camera.xfm.p), Vec3fa(normalize(x*camera.xfm.l.vx + y*camera.xfm.l.vy + camera.xfm.l.vz)), 0.0f, inf);

  /* intersect ray with scene */
  RTCIntersectArguments iargs;
  rtcInitIntersectArguments(&iargs);
  iargs.feature_mask = (RTCFeatureFlags) (FEATURE_MASK);
  rtcTraversableIntersect1(data.g_traversable,RTCRayHit_(ray),&iargs);
  RayStats_addRay(stats);

  /* shade pixels */
  Vec3fa color = Vec3fa(0.0f);
  if (ray.geomID != RTC_INVALID_GEOMETRY_ID)
  {
    /* interpolate diffuse color */
    Vec3fa diffuse = Vec3fa(1.0f,0.0f,0.0f);
    if (ray.geomID > 0)
    {
      switch (ray.geomID) {
      case 1: case 2: case 6: diffuse = interpolate_linear(data,ray.primID,ray.u); break;
      case 3: case 4: case 5: diffuse = interpolate_bspline(data,ray.primID,ray.u); break;
      case 7: case 8: case 9: diffuse = interpolate_catmull_rom(data,ray.primID,ray.u); break;
      }

      diffuse = 0.5f*diffuse;
    }

    /* calculate smooth shading normal */
    Vec3fa Ng = normalize(ray.Ng);
    color = color + diffuse*0.5f;
    Vec3fa lightDir = normalize(Vec3fa(-1,-1,-1));

    /* initialize shadow ray */
    Ray shadow(ray.org + ray.tfar*ray.dir, neg(lightDir), 0.001f, inf, 0.0f);

    /* trace shadow ray */
    RTCOccludedArguments sargs;
    rtcInitOccludedArguments(&sargs);
    sargs.feature_mask = (RTCFeatureFlags) (FEATURE_MASK);
    rtcTraversableOccluded1(data.g_traversable,RTCRay_(shadow),&sargs);
    RayStats_addShadowRay(stats);

    /* add light contribution */
    if (shadow.tfar >= 0.0f) {
      Vec3fa r = normalize(reflect(ray.dir,Ng));
      float s = pow(clamp(dot(r,lightDir),0.0f,1.0f),10.0f);
      float d = clamp(-dot(lightDir,Ng),0.0f,1.0f);
      color = color + diffuse*d + 0.5f*Vec3fa(s);
    }
  }

  /* write color to framebuffer */
  unsigned int r = (unsigned int) (255.0f * clamp(color.x,0.0f,1.0f));
  unsigned int g = (unsigned int) (255.0f * clamp(color.y,0.0f,1.0f));
  unsigned int b = (unsigned int) (255.0f * clamp(color.z,0.0f,1.0f));
  pixels[y*width+x] = (b << 16) + (g << 8) + r;
}